

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O3

GetblockResponse * __thiscall
Future<GetblockResponse>::get
          (GetblockResponse *__return_storage_ptr__,Future<GetblockResponse> *this)

{
  element_type *peVar1;
  unsigned_long_long uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  GetblockResponse local_70;
  
  if ((this->is_done_ == false) &&
     (peVar1 = (this->task_).
               super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (**peVar1->_vptr_AsyncTask)(&local_70);
    (this->result_).super_NamenodeResponse.type_ = local_70.super_NamenodeResponse.type_;
    (this->result_).super_NamenodeResponse.error_ = local_70.super_NamenodeResponse.error_;
    (this->result_).block_info_.datanode_info_.storage_type_ =
         local_70.block_info_.datanode_info_.storage_type_;
    (this->result_).block_info_.datanode_info_.storage_class_ =
         local_70.block_info_.datanode_info_.storage_class_;
    (this->result_).block_info_.datanode_info_.location_class_ =
         local_70.block_info_.datanode_info_.location_class_;
    (this->result_).block_info_.datanode_info_.ip_address_ =
         local_70.block_info_.datanode_info_.ip_address_;
    (this->result_).block_info_.datanode_info_.port_ = local_70.block_info_.datanode_info_.port_;
    (this->result_).block_info_.lba_ = local_70.block_info_.lba_;
    (this->result_).block_info_.addr_ = local_70.block_info_.addr_;
    (this->result_).block_info_.length_ = local_70.block_info_.length_;
    (this->result_).block_info_.lkey_ = local_70.block_info_.lkey_;
    (this->result_).error_ = local_70.error_;
    GetblockResponse::~GetblockResponse(&local_70);
    this->is_done_ = true;
  }
  sVar3 = (this->result_).super_NamenodeResponse.error_;
  (__return_storage_ptr__->super_NamenodeResponse).type_ =
       (this->result_).super_NamenodeResponse.type_;
  (__return_storage_ptr__->super_NamenodeResponse).error_ = sVar3;
  (__return_storage_ptr__->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_00130910;
  (__return_storage_ptr__->block_info_)._vptr_BlockInfo = (_func_int **)&PTR__BlockInfo_00131a50;
  (__return_storage_ptr__->block_info_).datanode_info_._vptr_DatanodeInfo =
       (_func_int **)&PTR__DatanodeInfo_00131a10;
  (__return_storage_ptr__->block_info_).datanode_info_.port_ =
       (this->result_).block_info_.datanode_info_.port_;
  iVar4 = (this->result_).block_info_.datanode_info_.storage_class_;
  iVar5 = (this->result_).block_info_.datanode_info_.location_class_;
  iVar6 = (this->result_).block_info_.datanode_info_.ip_address_;
  (__return_storage_ptr__->block_info_).datanode_info_.storage_type_ =
       (this->result_).block_info_.datanode_info_.storage_type_;
  (__return_storage_ptr__->block_info_).datanode_info_.storage_class_ = iVar4;
  (__return_storage_ptr__->block_info_).datanode_info_.location_class_ = iVar5;
  (__return_storage_ptr__->block_info_).datanode_info_.ip_address_ = iVar6;
  uVar2 = (this->result_).block_info_.addr_;
  (__return_storage_ptr__->block_info_).lba_ = (this->result_).block_info_.lba_;
  (__return_storage_ptr__->block_info_).addr_ = uVar2;
  iVar4 = (this->result_).block_info_.lkey_;
  (__return_storage_ptr__->block_info_).length_ = (this->result_).block_info_.length_;
  (__return_storage_ptr__->block_info_).lkey_ = iVar4;
  __return_storage_ptr__->error_ = (this->result_).error_;
  return __return_storage_ptr__;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }